

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O2

void rile_shk(monst *shkp)

{
  long lVar1;
  int *piVar2;
  int iVar3;
  
  shkp->field_0x62 = shkp->field_0x62 & 0xbf;
  if (*(char *)((long)&shkp[0x1b].meating + 2) == '\0') {
    lVar1 = *(long *)&shkp[0x1b].mnum;
    *(undefined1 *)((long)&shkp[0x1b].meating + 2) = 1;
    piVar2 = (int *)(lVar1 + 8);
    for (iVar3 = (int)*(short *)((long)&shkp[0x1b].misc_worn_check + 2); 0 < iVar3;
        iVar3 = iVar3 + -1) {
      *piVar2 = (int)(((long)*piVar2 + 2) / 3) + *piVar2;
      piVar2 = piVar2 + 4;
    }
  }
  return;
}

Assistant:

static void rile_shk(struct monst *shkp)
{
	NOTANGRY(shkp) = FALSE;	/* make angry */
	if (!ESHK(shkp)->surcharge) {
		struct bill_x *bp = ESHK(shkp)->bill_p;
		int ct = ESHK(shkp)->billct;

		ESHK(shkp)->surcharge = TRUE;
		while (ct-- > 0) {
			long surcharge = (bp->price + 2L) / 3L;
			bp->price += surcharge;
			bp++;
		}
	}
}